

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS
ref_recon_extrapolate_kexact(REF_GRID ref_grid,REF_DBL *recon,REF_BOOL *replace,REF_INT ldim)

{
  double dVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  double dVar5;
  double dVar6;
  REF_CLOUD pRVar7;
  REF_DBL RVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  REF_STATUS RVar12;
  REF_CELL pRVar13;
  REF_CLOUD *one_layer;
  long lVar14;
  REF_DBL *a;
  REF_DBL *q;
  REF_DBL *pRVar15;
  REF_DBL *pRVar16;
  int iVar17;
  REF_ADJ pRVar18;
  undefined8 uVar19;
  uint uVar20;
  REF_CLOUD *ref_cloud_ptr;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long global;
  ulong uVar24;
  double *pdVar25;
  char *pcVar26;
  REF_DBL *pRVar27;
  long lVar28;
  bool bVar29;
  REF_CLOUD ref_cloud;
  ulong local_448;
  REF_CLOUD local_428;
  ulong local_420;
  REF_DBL *local_418;
  long local_410;
  long local_408;
  REF_GRID local_400;
  double local_3f8 [10];
  REF_DBL local_3a8;
  REF_DBL local_3a0;
  REF_DBL local_398;
  REF_DBL local_390;
  double adStack_88 [9];
  REF_DBL local_40;
  
  ref_node = ref_grid->node;
  if (ref_grid->twod == 0) {
    pRVar13 = ref_grid->cell[8];
  }
  else {
    pRVar13 = ref_grid->cell[3];
  }
  uVar9 = ref_node_ghost_int(ref_node,replace,ldim);
  if (uVar9 == 0) {
    uVar9 = ref_node_ghost_dbl(ref_node,recon,ldim);
    if (uVar9 == 0) {
      if (0 < ldim) {
        local_420 = (ulong)(uint)ldim;
        uVar9 = ref_node->max;
        local_448 = 0;
        local_400 = ref_grid;
        do {
          if ((int)uVar9 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD negative");
            return 1;
          }
          one_layer = (REF_CLOUD *)malloc((ulong)uVar9 << 3);
          if (one_layer == (REF_CLOUD *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x4a7,"ref_recon_extrapolate_kexact","malloc one_layer of REF_CLOUD NULL");
            return 2;
          }
          if (uVar9 != 0) {
            memset(one_layer,0,(ulong)uVar9 << 3);
            lVar28 = 0;
            ref_cloud_ptr = one_layer;
            do {
              if (-1 < ref_node->global[lVar28]) {
                uVar9 = ref_cloud_create(ref_cloud_ptr,4);
                if (uVar9 != 0) {
                  pcVar26 = "cloud storage";
                  uVar19 = 0x4a9;
                  goto LAB_001b84e3;
                }
                uVar9 = ref_node->max;
              }
              lVar28 = lVar28 + 1;
              ref_cloud_ptr = ref_cloud_ptr + 1;
            } while (lVar28 < (int)uVar9);
            if (0 < (int)uVar9) {
              lVar28 = 0;
              do {
                if ((((-1 < ref_node->global[lVar28]) &&
                     (ref_node->ref_mpi->id == ref_node->part[lVar28])) &&
                    (pRVar18 = pRVar13->ref_adj, lVar28 < pRVar18->nnode)) &&
                   (lVar23 = (long)pRVar18->first[lVar28], lVar23 != -1)) {
                  pRVar4 = pRVar18->item + lVar23;
                  iVar10 = pRVar13->node_per;
                  while( true ) {
                    if (0 < iVar10) {
                      iVar2 = pRVar4->ref;
                      lVar21 = 0;
                      do {
                        uVar9 = pRVar13->c2n[(long)pRVar13->size_per * (long)iVar2 + lVar21];
                        iVar17 = uVar9 * ldim + (int)local_448;
                        if (replace[iVar17] == 0) {
                          global = -1;
                          if (((-1 < (int)uVar9) && ((int)uVar9 < ref_node->max)) &&
                             (global = ref_node->global[uVar9], global < 0)) {
                            global = -1;
                          }
                          lVar14 = (long)(int)uVar9;
                          pRVar27 = ref_node->real;
                          local_3a8 = pRVar27[lVar14 * 0xf];
                          local_3a0 = pRVar27[lVar14 * 0xf + 1];
                          local_398 = pRVar27[lVar14 * 0xf + 2];
                          local_390 = recon[iVar17];
                          uVar9 = ref_cloud_store(one_layer[lVar28],global,&local_3a8);
                          if (uVar9 != 0) {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                   ,0x48e,"ref_recon_local_immediate_replace_cloud",(ulong)uVar9,
                                   "store cloud stencil");
                            pcVar26 = "fill";
                            uVar19 = 0x4ad;
                            goto LAB_001b84e3;
                          }
                          iVar10 = pRVar13->node_per;
                        }
                        lVar21 = lVar21 + 1;
                      } while ((int)lVar21 < iVar10);
                      pRVar18 = pRVar13->ref_adj;
                    }
                    lVar23 = (long)pRVar18->item[(int)lVar23].next;
                    if (lVar23 == -1) break;
                    pRVar4 = pRVar18->item + lVar23;
                  }
                  uVar9 = ref_node->max;
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 < (int)uVar9);
            }
          }
          uVar9 = ref_recon_ghost_cloud(one_layer,ref_node);
          if (uVar9 != 0) {
            pcVar26 = "fill ghosts";
            uVar19 = 0x4ae;
            goto LAB_001b84e3;
          }
          uVar9 = ref_node->max;
          if (0 < (int)uVar9) {
            lVar28 = 0;
            do {
              if (((-1 < ref_node->global[lVar28]) &&
                  (ref_node->ref_mpi->id == ref_node->part[lVar28])) &&
                 (lVar23 = lVar28 * local_420 + local_448, replace[lVar23] != 0)) {
                uVar9 = ref_cloud_deep_copy(&local_428,one_layer[lVar28]);
                if (uVar9 != 0) {
                  pcVar26 = "create ref_cloud";
                  uVar19 = 0x4b2;
                  goto LAB_001b84e3;
                }
                uVar20 = 2;
                local_410 = lVar23;
                local_408 = lVar28;
                do {
                  pRVar7 = local_428;
                  uVar9 = local_428->n;
                  uVar22 = (ulong)uVar9;
                  if (9 < (int)uVar9) {
                    pRVar27 = ref_node->real;
                    a = (REF_DBL *)malloc(uVar22 * 0x50);
                    if (a == (REF_DBL *)0x0) {
                      uVar19 = 0x27a;
                    }
                    else {
                      q = (REF_DBL *)malloc(uVar22 * 0x50);
                      if (q == (REF_DBL *)0x0) {
                        uVar19 = 0x27b;
                      }
                      else {
                        pRVar15 = (REF_DBL *)malloc(800);
                        if (pRVar15 != (REF_DBL *)0x0) {
                          pRVar3 = pRVar7->aux;
                          iVar10 = pRVar7->naux;
                          pRVar16 = pRVar27 + lVar28 * 0xf;
                          dVar5 = *pRVar16;
                          dVar6 = pRVar16[1];
                          dVar1 = pRVar27[lVar28 * 0xf + 2];
                          uVar24 = 0;
                          pRVar27 = a;
                          do {
                            lVar23 = uVar24 * (long)iVar10;
                            local_3f8[8] = pRVar3[lVar23 + 2] - dVar1;
                            pdVar25 = pRVar3 + lVar23;
                            local_3f8[6] = *pdVar25 - dVar5;
                            local_3f8[7] = pdVar25[1] - dVar6;
                            local_3f8[0] = local_3f8[6] * 0.5 * local_3f8[6];
                            local_3f8[1] = local_3f8[7] * local_3f8[6];
                            local_3f8[2] = local_3f8[8] * local_3f8[6];
                            local_3f8[3] = local_3f8[7] * 0.5 * local_3f8[7];
                            local_3f8[4] = local_3f8[7] * local_3f8[8];
                            local_3f8[5] = local_3f8[8] * 0.5 * local_3f8[8];
                            local_3f8[9] = 1.0;
                            lVar23 = 0;
                            pRVar16 = pRVar27;
                            do {
                              *pRVar16 = local_3f8[lVar23];
                              lVar23 = lVar23 + 1;
                              pRVar16 = pRVar16 + uVar22;
                            } while (lVar23 != 10);
                            uVar24 = uVar24 + 1;
                            pRVar27 = pRVar27 + 1;
                          } while (uVar24 != uVar22);
                          local_418 = pRVar15;
                          uVar11 = ref_matrix_qr(uVar9,10,a,q,pRVar15);
                          if (uVar11 == 0) {
                            pRVar27 = &local_3a8;
                            memset(pRVar27,0,0x370);
                            pRVar15 = local_418;
                            lVar23 = 0;
                            pRVar16 = local_418;
                            do {
                              lVar21 = 0;
                              do {
                                *(double *)((long)pRVar27 + lVar21) =
                                     *(double *)((long)pRVar16 + lVar21) +
                                     *(double *)((long)pRVar27 + lVar21);
                                lVar21 = lVar21 + 0x50;
                              } while (lVar21 != 800);
                              lVar23 = lVar23 + 1;
                              pRVar27 = pRVar27 + 1;
                              pRVar16 = pRVar16 + 1;
                            } while (lVar23 != 10);
                            uVar11 = pRVar7->n;
                            if ((long)(int)uVar11 < 1) {
                              uVar11 = 0;
                            }
                            else {
                              pRVar27 = pRVar7->aux;
                              iVar10 = pRVar7->naux;
                              lVar23 = 0;
                              pRVar16 = q;
                              do {
                                dVar1 = pRVar27[lVar23 * iVar10 + 3];
                                lVar21 = 0;
                                pdVar25 = pRVar16;
                                do {
                                  adStack_88[lVar21] = *pdVar25 * dVar1 + adStack_88[lVar21];
                                  lVar21 = lVar21 + 1;
                                  pdVar25 = pdVar25 + uVar22;
                                } while (lVar21 != 10);
                                lVar23 = lVar23 + 1;
                                pRVar16 = pRVar16 + 1;
                              } while (lVar23 != (int)uVar11);
                            }
                            if (uVar9 == uVar11) {
                              RVar12 = ref_matrix_solve_ab(10,0xb,&local_3a8);
                              RVar8 = local_40;
                              if (RVar12 == 0) {
                                free(pRVar15);
                                free(q);
                                free(a);
                                recon[local_410] = RVar8;
                                replace[local_410] = 0;
                                break;
                              }
                            }
                            else {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                     ,0x2b4,"ref_recon_kexact_center","b row miscount",uVar22,
                                     (ulong)uVar11);
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                                   ,0x29c,"ref_recon_kexact_center",(ulong)uVar11,
                                   "kexact lsq hess qr");
                            pRVar15 = local_418;
                          }
                          free(pRVar15);
                          free(q);
                          free(a);
                          goto LAB_001b8b3b;
                        }
                        uVar19 = 0x27c;
                      }
                    }
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                           ,uVar19,"ref_recon_kexact_center");
                  }
LAB_001b8b3b:
                  uVar9 = ref_recon_grow_cloud_one_layer(local_428,one_layer,ref_node);
                  if (uVar9 != 0) {
                    pcVar26 = "grow";
                    uVar19 = 0x4bc;
                    goto LAB_001b84e3;
                  }
                  bVar29 = uVar20 < 8;
                  uVar20 = uVar20 + 1;
                } while (bVar29);
                uVar9 = ref_cloud_free(local_428);
                if (uVar9 != 0) {
                  pcVar26 = "free ref_cloud";
                  uVar19 = 0x4bf;
                  goto LAB_001b84e3;
                }
                uVar9 = ref_node->max;
                lVar28 = local_408;
              }
              lVar28 = lVar28 + 1;
            } while (lVar28 < (int)uVar9);
            if (0 < (int)uVar9) {
              lVar28 = 0;
              do {
                if (-1 < ref_node->global[lVar28]) {
                  ref_cloud_free(one_layer[lVar28]);
                  uVar9 = ref_node->max;
                }
                lVar28 = lVar28 + 1;
              } while (lVar28 < (int)uVar9);
            }
          }
          free(one_layer);
          local_448 = local_448 + 1;
          ref_grid = local_400;
        } while (local_448 != local_420);
      }
      uVar9 = ref_node_ghost_int(ref_node,replace,ldim);
      if (uVar9 == 0) {
        uVar9 = ref_node_ghost_dbl(ref_node,recon,ldim);
        if (uVar9 == 0) {
          uVar9 = ref_recon_extrapolate_zeroth(ref_grid,recon,replace,ldim);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar26 = "zero";
          uVar19 = 0x4cc;
        }
        else {
          pcVar26 = "update ghosts";
          uVar19 = 0x4ca;
        }
      }
      else {
        pcVar26 = "update ghosts";
        uVar19 = 0x4c9;
      }
    }
    else {
      pcVar26 = "update ghosts";
      uVar19 = 0x4a4;
    }
  }
  else {
    pcVar26 = "update ghosts";
    uVar19 = 0x4a3;
  }
LAB_001b84e3:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar19,
         "ref_recon_extrapolate_kexact",(ulong)uVar9,pcVar26);
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_recon_extrapolate_kexact(REF_GRID ref_grid,
                                                REF_DBL *recon,
                                                REF_BOOL *replace,
                                                REF_INT ldim) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT i, node;
  REF_CLOUD *one_layer, ref_cloud;
  REF_DBL center;
  REF_STATUS status;
  REF_INT layer;
  if (ref_grid_twod(ref_grid)) ref_cell = ref_grid_tri(ref_grid);

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  for (i = 0; i < ldim; i++) {
    ref_malloc_init(one_layer, ref_node_max(ref_node), REF_CLOUD, NULL);
    each_ref_node_valid_node(ref_node, node) {
      RSS(ref_cloud_create(&(one_layer[node]), 4), "cloud storage");
    }
    RSS(ref_recon_local_immediate_replace_cloud(one_layer, ref_node, ref_cell,
                                                recon, replace, ldim, i),
        "fill");
    RSS(ref_recon_ghost_cloud(one_layer, ref_node), "fill ghosts");
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node) && replace[i + ldim * node]) {
        RSS(ref_cloud_deep_copy(&ref_cloud, one_layer[node]),
            "create ref_cloud");
        status = REF_INVALID;
        for (layer = 2; status != REF_SUCCESS && layer <= 8; layer++) {
          status = ref_recon_kexact_center(ref_node_xyz_ptr(ref_node, node),
                                           ref_cloud, &center);
          if (REF_SUCCESS == status) {
            recon[i + ldim * node] = center;
            replace[i + ldim * node] = REF_FALSE;
          } else {
            RSS(ref_recon_grow_cloud_one_layer(ref_cloud, one_layer, ref_node),
                "grow");
          }
        }
        RSS(ref_cloud_free(ref_cloud), "free ref_cloud");
      }
    }

    each_ref_node_valid_node(ref_node, node) {
      ref_cloud_free(one_layer[node]); /* no-op for null */
    }
    ref_free(one_layer);
  }

  RSS(ref_node_ghost_int(ref_node, replace, ldim), "update ghosts");
  RSS(ref_node_ghost_dbl(ref_node, recon, ldim), "update ghosts");

  RSS(ref_recon_extrapolate_zeroth(ref_grid, recon, replace, ldim), "zero");

  return REF_SUCCESS;
}